

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

void Gia_ManEquivPrintOne(Gia_Man_t *p,int i,int Counter)

{
  uint *puVar1;
  Gia_Rpr_t GVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)i;
  uVar3 = Gia_ManEquivCountOne(p,i);
  Abc_Print(1,"Class %4d :  Num = %2d  {",(ulong)(uint)Counter,(ulong)uVar3);
  if (((~(uint)p->pReprs[i] & 0xfffffff) == 0) && (0 < p->pNexts[i])) {
    if (0 < i) {
      do {
        Abc_Print(1," %d",uVar4);
        GVar2 = p->pReprs[uVar4];
        if (0x3fffffff < (uint)GVar2) {
          Abc_Print(1," <%d%d>",(ulong)((uint)GVar2 >> 0x1e & 1),(ulong)((uint)GVar2 >> 0x1f));
        }
        puVar1 = (uint *)(p->pNexts + uVar4);
        uVar4 = (ulong)*puVar1;
      } while (0 < (int)*puVar1);
    }
    Abc_Print(1," }\n");
    return;
  }
  __assert_fail("Gia_ObjIsHead(p, i)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                ,0x1cb,"void Gia_ManEquivPrintOne(Gia_Man_t *, int, int)");
}

Assistant:

void Gia_ManEquivPrintOne( Gia_Man_t * p, int i, int Counter )
{
    int Ent;
    Abc_Print( 1, "Class %4d :  Num = %2d  {", Counter, Gia_ManEquivCountOne(p, i) );
    Gia_ClassForEachObj( p, i, Ent )
    {
        Abc_Print( 1," %d", Ent );
        if ( p->pReprs[Ent].fColorA || p->pReprs[Ent].fColorB )
            Abc_Print( 1," <%d%d>", p->pReprs[Ent].fColorA, p->pReprs[Ent].fColorB );
    }
    Abc_Print( 1, " }\n" );
}